

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tld-tree.c
# Opt level: O1

void faup_tld_tree_add_tld(char *tld,void *user_data)

{
  undefined8 *puVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  size_t sVar6;
  undefined1 *puVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  
  sVar6 = strlen(tld);
  if (*tld == '!') {
    puVar1 = (undefined8 *)((long)user_data + 8);
    lVar3 = *(long *)((long)user_data + 8);
  }
  else {
    puVar1 = (undefined8 *)((long)user_data + 0x10);
    lVar3 = *(long *)((long)user_data + 0x10);
  }
  if (lVar3 == 0) {
    puVar7 = (undefined1 *)calloc(1,0x18);
    *puVar1 = puVar7;
    if (puVar7 == (undefined1 *)0x0) {
LAB_00119312:
      fprintf(_stderr,"Error adding the tld \'%s\' to the tree\n",tld);
      return;
    }
    *puVar7 = 0;
  }
  uVar10 = (uint)sVar6;
  if (0 < (int)uVar10) {
    pcVar12 = tld + (uVar10 & 0x7fffffff);
    uVar11 = 0;
    pcVar9 = (char *)*puVar1;
    do {
      uVar11 = uVar11 + 1;
      if ((int)uVar11 < (int)uVar10) {
        bVar13 = pcVar12[-2] == '.';
        bVar14 = pcVar12[-2] == '!';
      }
      else {
        bVar13 = false;
        bVar14 = false;
      }
      pcVar12 = pcVar12 + -1;
      pcVar4 = *(char **)(pcVar9 + 0x10);
      if (*(char **)(pcVar9 + 0x10) == (char *)0x0) {
        cVar2 = *pcVar12;
        pcVar8 = (char *)calloc(1,0x18);
        *(char **)(pcVar9 + 0x10) = pcVar8;
        if (pcVar8 == (char *)0x0) goto LAB_00119312;
        *pcVar8 = cVar2;
        *(uint *)(pcVar8 + 4) = (uint)(byte)(bVar13 | bVar14 | uVar11 == uVar10);
      }
      else {
        do {
          pcVar8 = pcVar4;
          pcVar4 = *(char **)(pcVar8 + 8);
          if (pcVar4 == (char *)0x0) break;
        } while (*pcVar8 != *pcVar12);
        cVar2 = *pcVar12;
        if (*pcVar8 == cVar2) {
          if ((bVar13 != false || bVar14 != false) || uVar11 == uVar10) {
            pcVar8[4] = '\x01';
            pcVar8[5] = '\0';
            pcVar8[6] = '\0';
            pcVar8[7] = '\0';
          }
        }
        else {
          bVar5 = true;
          if (pcVar4 == (char *)0x0) {
            pcVar9 = (char *)calloc(1,0x18);
            bVar5 = true;
            *(char **)(pcVar8 + 8) = pcVar9;
            if (pcVar9 != (char *)0x0) {
              *pcVar9 = cVar2;
              *(uint *)(pcVar9 + 4) = (uint)(byte)(uVar11 == uVar10 | bVar13 | bVar14);
              bVar5 = false;
              pcVar8 = pcVar9;
            }
          }
          if (bVar5) goto LAB_00119312;
        }
      }
      pcVar9 = pcVar8;
    } while (uVar11 != uVar10);
  }
  return;
}

Assistant:

static void faup_tld_tree_add_tld(char *tld, void *user_data)
{
	int retval;

	TLDNode *Tree = (TLDNode *)user_data;

	retval = faup_tld_tree_add_node(&Tree, tld, strlen(tld));
	if (retval) {
		fprintf(stderr, "Error adding the tld '%s' to the tree\n", tld);
	}

}